

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

void __thiscall Dashel::FileStream::FileStream(FileStream *this,void **vtt,string *targetName)

{
  _func_int *p_Var1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string *psVar5;
  DashelException *pDVar6;
  int *piVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string errorMessage;
  string mode;
  string name;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *targetName_local;
  void **vtt_local;
  FileStream *this_local;
  
  local_20 = targetName;
  targetName_local = (string *)vtt;
  vtt_local = (void **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"file",&local_41);
  FileDescriptorStream::FileDescriptorStream(&this->super_FileDescriptorStream,vtt + 1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.
  _vptr_SelectableStream = (_func_int **)*vtt;
  *(void **)((long)&(this->super_FileDescriptorStream).super_DisconnectableStream.
                    super_SelectableStream._vptr_SelectableStream +
            (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                  super_SelectableStream._vptr_SelectableStream[-3]) = vtt[7];
  ParameterSet::add((ParameterSet *)
                    (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                      super_SelectableStream.field_0x30 +
                    (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                          super_SelectableStream._vptr_SelectableStream[-3]),
                    "file:name;mode=read;fd=-1");
  p_Var1 = (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.
           _vptr_SelectableStream[-3];
  pcVar4 = (char *)std::__cxx11::string::c_str();
  ParameterSet::add((ParameterSet *)
                    (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                      super_SelectableStream.field_0x30 + (long)p_Var1),pcVar4);
  iVar3 = ParameterSet::get<int>
                    ((ParameterSet *)
                     (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                       super_SelectableStream.field_0x30 +
                     (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                           super_SelectableStream._vptr_SelectableStream[-3]),"fd");
  (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.fd = iVar3;
  if ((this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.fd < 0) {
    psVar5 = ParameterSet::get_abi_cxx11_
                       ((ParameterSet *)
                        (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                          super_SelectableStream.field_0x30 +
                        (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                              super_SelectableStream._vptr_SelectableStream[-3]),"name");
    std::__cxx11::string::string((string *)(mode.field_2._M_local_buf + 8),(string *)psVar5);
    psVar5 = ParameterSet::get_abi_cxx11_
                       ((ParameterSet *)
                        (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                          super_SelectableStream.field_0x30 +
                        (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                              super_SelectableStream._vptr_SelectableStream[-3]),"mode");
    std::__cxx11::string::string((string *)(errorMessage.field_2._M_local_buf + 8),(string *)psVar5)
    ;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&errorMessage.field_2 + 8),"read");
    if (bVar2) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iVar3 = open(pcVar4,0);
      (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.fd =
           iVar3;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&errorMessage.field_2 + 8),"write");
      if (bVar2) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iVar3 = creat(pcVar4,0x1b0);
        (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.fd =
             iVar3;
        (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.
        writeOnly = true;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&errorMessage.field_2 + 8),"readwrite");
        if (!bVar2) {
          pDVar6 = (DashelException *)__cxa_allocate_exception(0x20);
          DashelException::DashelException
                    (pDVar6,InvalidTarget,0,"Invalid file mode.",(Stream *)0x0);
          __cxa_throw(pDVar6,&DashelException::typeinfo,DashelException::~DashelException);
        }
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iVar3 = open(pcVar4,2);
        (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.fd =
             iVar3;
      }
    }
    if ((this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.fd ==
        -1) {
      std::operator+(&local_118,"Cannot open file ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&mode.field_2 + 8));
      std::operator+(&local_f8,&local_118," for ");
      std::operator+(&local_d8,&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&errorMessage.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     &local_d8,".");
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      pDVar6 = (DashelException *)__cxa_allocate_exception(0x20);
      piVar7 = __errno_location();
      iVar3 = *piVar7;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      DashelException::DashelException(pDVar6,ConnectionFailed,iVar3,pcVar4,(Stream *)0x0);
      __cxa_throw(pDVar6,&DashelException::typeinfo,DashelException::~DashelException);
    }
    std::__cxx11::string::~string((string *)(errorMessage.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(mode.field_2._M_local_buf + 8));
  }
  else {
    ParameterSet::erase((ParameterSet *)
                        (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                          super_SelectableStream.field_0x30 +
                        (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                              super_SelectableStream._vptr_SelectableStream[-3]),"fd");
  }
  return;
}

Assistant:

explicit FileStream(const string& targetName) :
			Stream("file"),
			FileDescriptorStream("file")
		{
			target.add("file:name;mode=read;fd=-1");
			target.add(targetName.c_str());
			fd = target.get<int>("fd");
			if (fd < 0)
			{
				const std::string name = target.get("name");
				const std::string mode = target.get("mode");

				// open file
				if (mode == "read")
					fd = open(name.c_str(), O_RDONLY);
				else if (mode == "write")
					fd = creat(name.c_str(), S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP), writeOnly = true;
				else if (mode == "readwrite")
					fd = open(name.c_str(), O_RDWR);
				else
					throw DashelException(DashelException::InvalidTarget, 0, "Invalid file mode.");
				if (fd == -1)
				{
					string errorMessage = "Cannot open file " + name + " for " + mode + ".";
					throw DashelException(DashelException::ConnectionFailed, errno, errorMessage.c_str());
				}
			}
			else
			{
				// remove file descriptor information from target name
				target.erase("fd");
			}
		}